

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O2

MPP_RET mpp_task_meta_get_s64(MppTask task,MppMetaKey key,RK_S64 *val,RK_S64 default_val)

{
  MPP_RET MVar1;
  
  MVar1 = check_mpp_task_name(task);
  if (MVar1 == MPP_OK) {
    MVar1 = mpp_meta_get_s64(*(MppMeta *)((long)task + 0x28),key,val);
    if (MVar1 == MPP_OK) {
      MVar1 = MPP_OK;
    }
    else {
      *val = default_val;
    }
  }
  else {
    MVar1 = MPP_NOK;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_task_meta_get_s64(MppTask task, MppMetaKey key, RK_S64 *val, RK_S64 default_val)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_s64(impl->meta, key, val);
    if (ret)
        *val = default_val;
    return ret;
}